

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O2

void pelelm_dcma(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *param_6,
                Real param_7,int *param_8,int param_9)

{
  Box *pBVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 uVar16;
  Real RVar17;
  int n;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  double *pdVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  GpuArray<double,_9U> *pGVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  double *pdVar34;
  long lVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int n_1;
  long lVar41;
  byte bVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double *local_3b8;
  double *local_3b0;
  double local_2e8 [9];
  double local_2a0 [15];
  int local_228;
  int iStack_224;
  double local_c8 [8];
  undefined1 *local_88;
  GpuArray<double,_9U> fact_lcl;
  
  bVar42 = 0;
  pdVar11 = (derfab->super_BaseFab<double>).dptr;
  iVar3 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar4 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar33 = ((long)(derfab->super_BaseFab<double>).domain.bigend.vect[0] - (long)iVar3) + 1;
  iVar5 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar27 = (((long)(derfab->super_BaseFab<double>).domain.bigend.vect[1] + 1) - (long)iVar5) *
           lVar33;
  lVar39 = (((long)(derfab->super_BaseFab<double>).domain.bigend.vect[2] - (long)iVar4) + 1) *
           lVar27;
  lVar28 = lVar39 * dcomp;
  lVar23 = (dcomp + 1) * lVar39;
  pBVar1 = &(datfab->super_BaseFab<double>).domain;
  lVar29 = ((long)(datfab->super_BaseFab<double>).domain.bigend.vect[0] -
           (long)(pBVar1->smallend).vect[0]) + 1;
  pdVar12 = (datfab->super_BaseFab<double>).dptr;
  iVar6 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  uVar16 = *(undefined8 *)(pBVar1->smallend).vect;
  lVar25 = (((long)(datfab->super_BaseFab<double>).domain.bigend.vect[1] + 1) -
           (long)(datfab->super_BaseFab<double>).domain.smallend.vect[1]) * lVar29;
  lVar40 = (((long)(datfab->super_BaseFab<double>).domain.bigend.vect[2] - (long)iVar6) + 1) *
           lVar25;
  amrex::Abort_host("C12H25O2 is not present in your chemistry: do not use dcma.");
  RVar17 = PeleLM::Zox;
  for (lVar18 = 0; lVar18 != 9; lVar18 = lVar18 + 1) {
    fact_lcl.arr[lVar18] = PeleLM::spec_Bilger_fact._M_elems[lVar18];
  }
  dVar43 = PeleLM::Zfu - PeleLM::Zox;
  pGVar30 = &fact_lcl;
  pdVar34 = local_2a0 + 2;
  for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
    *pdVar34 = pGVar30->arr[0];
    pGVar30 = (GpuArray<double,_9U> *)((long)pGVar30 + ((ulong)bVar42 * -2 + 1) * 8);
    pdVar34 = pdVar34 + (ulong)bVar42 * -2 + 1;
  }
  iVar7 = (bx->smallend).vect[0];
  lVar20 = (long)(bx->smallend).vect[1];
  iVar8 = (bx->bigend).vect[0];
  iVar9 = (bx->bigend).vect[2];
  iVar10 = (bx->bigend).vect[1];
  lVar18 = (long)iVar7 * 8;
  for (lVar36 = (long)(bx->smallend).vect[2]; (int)lVar36 <= iVar9; lVar36 = lVar36 + 1) {
    local_228 = (int)uVar16;
    iStack_224 = (int)((ulong)uVar16 >> 0x20);
    lVar31 = (long)(int)lVar36;
    lVar21 = (lVar31 - iVar4) * lVar27;
    lVar32 = (lVar31 - iVar4) * lVar27;
    local_3b0 = (double *)
                ((long)pdVar12 +
                (lVar20 - iStack_224) * lVar29 * 8 + (lVar36 - iVar6) * lVar25 * 8 +
                (long)local_228 * -8 + lVar18 + lVar40 * 8);
    local_3b8 = (double *)
                ((long)pdVar11 +
                (lVar20 - iVar5) * lVar33 * 8 + (lVar36 - iVar4) * lVar27 * 8 + (long)iVar3 * -8 +
                lVar18 + lVar39 * 0x58);
    for (lVar35 = lVar20; lVar35 <= iVar10; lVar35 = lVar35 + 1) {
      if (iVar7 <= iVar8) {
        lVar19 = (lVar35 - iVar5) * lVar33;
        lVar22 = (lVar35 - iVar5) * lVar33;
        pdVar34 = local_3b0;
        pdVar37 = local_3b8;
        lVar38 = (long)iVar7;
        do {
          dVar2 = pdVar12[(lVar31 - iVar6) * lVar25 +
                          (lVar35 - iStack_224) * lVar29 + (lVar38 - local_228)];
          lVar26 = lVar38 - iVar3;
          pdVar11[lVar28 + lVar21 + lVar19 + lVar26] = 0.0;
          dVar15 = 0.0;
          pdVar24 = pdVar34;
          for (lVar41 = 2; lVar41 != 0xb; lVar41 = lVar41 + 1) {
            dVar15 = dVar15 + *pdVar24 * local_2a0[lVar41] * (1.0 / dVar2);
            pdVar11[lVar28 + lVar21 + lVar19 + lVar26] = dVar15;
            pdVar24 = pdVar24 + lVar40;
          }
          pdVar11[lVar28 + lVar21 + lVar19 + lVar26] = (dVar15 - RVar17) * (1.0 / dVar43);
          dVar2 = pdVar11[lVar39 * 10 +
                          (lVar31 - iVar4) * lVar27 + (lVar35 - iVar5) * lVar33 + (lVar38 - iVar3)];
          dVar44 = dVar2 * dVar2;
          dVar45 = dVar2 * dVar44;
          dVar46 = dVar2 * dVar45;
          local_c8[0] = 0.49603174603174605;
          local_c8[1] = 0.03125195324707794;
          local_c8[2] = 0.055509297807382736;
          local_c8[3] = 0.9920634920634921;
          local_c8[4] = 0.06250390649415588;
          local_c8[5] = 0.05879931792791203;
          local_c8[6] = 0.030297521662727988;
          local_c8[7] = 0.029399658963956014;
          local_88 = &DAT_3fa246cdaf410bdd;
          dVar15 = 1.0 / dVar2;
          if (1000.0 <= dVar2) {
            local_2e8[0] = dVar15 * -835.033997 +
                           dVar46 * 3.16550358e-16 +
                           dVar45 * -2.30789455e-12 +
                           dVar44 * -1.8779429e-08 + dVar2 * 0.000350032206 + 2.99142337;
            local_2e8[1] = dVar15 * -1233.93018 +
                           dVar46 * -2.27287062e-16 +
                           dVar45 * 4.4382037e-12 +
                           dVar44 * -4.19613997e-08 + dVar2 * 0.000306759845 + 3.69757819;
            local_2e8[4] = dVar15 * 29230.8027 +
                           dVar46 * -8.736103e-17 +
                           dVar45 * 1.13776685e-12 +
                           dVar44 * -1.03426778e-09 + dVar2 * -1.37753096e-05 + 2.54205966;
            local_2e8[5] = dVar15 * 3683.62875 +
                           dVar46 * -2.66391752e-16 +
                           dVar45 * 7.63046685e-12 +
                           dVar44 * -8.63609193e-08 + dVar2 * 0.00052825224 + 2.86472886;
            local_2e8[6] = dVar15 * 111.856713 +
                           dVar46 * -2.1581707e-15 +
                           dVar45 * 2.85615925e-11 +
                           dVar44 * -2.11219383e-07 + dVar2 * 0.00111991006 + 4.0172109;
            local_2e8[7] = dVar15 * -18006.9609 +
                           dVar46 * -2.86330712e-15 +
                           dVar45 * 5.87225893e-11 +
                           dVar44 * -4.9156294e-07 + dVar2 * 0.0021680682 + 4.57316685;
            dVar47 = dVar46 * -1.27832357e-15 +
                     dVar45 * 3.00249098e-11 +
                     dVar44 * -2.9100867e-07 + dVar2 * 0.00152814644 + 2.67214561;
            dVar48 = dVar46 * -1.3506702e-15 +
                     dVar45 * 2.52426e-11 +
                     dVar44 * -1.89492033e-07 + dVar2 * 0.0007439885 + 2.92664;
            dVar13 = -29899.209;
            dVar14 = -922.7977;
          }
          else {
            local_2e8[0] = dVar15 * -1012.52087 +
                           dVar46 * 8.26974448e-14 +
                           dVar45 * -2.36885858e-11 +
                           dVar44 * -2.71433843e-07 + dVar2 * 0.000412472087 + 3.29812431;
            local_2e8[1] = dVar15 * -1005.24902 +
                           dVar46 * -1.75371078e-13 +
                           dVar45 * 3.28469308e-10 +
                           dVar44 * -1.91871682e-07 + dVar2 * 0.000563743175 + 3.2129364;
            local_2e8[4] = dVar15 * 29147.6445 +
                           dVar46 * 7.78139272e-14 +
                           dVar45 * -4.00710797e-10 +
                           dVar44 * 8.07010567e-07 + dVar2 * -0.000819083245 + 2.94642878;
            local_2e8[5] = dVar15 * 3346.30913 +
                           dVar46 * 4.12474758e-13 +
                           dVar45 * -1.44963411e-09 +
                           dVar44 * 2.1758823e-06 + dVar2 * -0.0016127247 + 4.12530561;
            local_2e8[6] = dVar15 * 294.80804 +
                           dVar46 * 1.85845025e-12 +
                           dVar45 * -6.06909735e-09 +
                           dVar44 * 7.05276303e-06 + dVar2 * -0.00237456025 + 4.30179801;
            local_2e8[7] = dVar15 * -17663.1465 +
                           dVar46 * 4.9430295e-13 +
                           dVar45 * -1.15645138e-09 +
                           dVar44 * -4.95004193e-08 + dVar2 * 0.0032846129 + 3.38875365;
            dVar47 = dVar46 * -5.01317694e-13 +
                     dVar45 * 1.74214532e-09 +
                     dVar44 * -2.11823211e-06 + dVar2 * 0.00173749123 + 3.38684249;
            dVar48 = dVar46 * -4.88971e-13 +
                     dVar45 * 1.41037875e-09 +
                     dVar44 * -1.321074e-06 + dVar2 * 0.00070412 + 3.298677;
            dVar13 = -30208.1133;
            dVar14 = -1020.9;
          }
          local_2e8[2] = dVar15 * dVar13 + dVar47;
          local_2e8[3] = dVar15 * 25471.627 +
                         dVar46 * 0.0 + dVar45 * 0.0 + dVar44 * 0.0 + dVar2 * 0.0 + 2.5;
          local_2e8[8] = dVar15 * dVar14 + dVar48;
          for (lVar41 = 0; lVar41 != 9; lVar41 = lVar41 + 1) {
            local_2e8[lVar41] = local_c8[lVar41] * dVar2 * 83144626.1815324 * local_2e8[lVar41];
          }
          pdVar11[lVar23 + lVar32 + lVar22 + (lVar38 - iVar3)] = 0.0;
          dVar2 = 0.0;
          pdVar24 = pdVar37;
          for (lVar41 = 0; lVar41 != 9; lVar41 = lVar41 + 1) {
            dVar15 = local_2e8[lVar41];
            local_2e8[lVar41] = dVar15 * 0.0001;
            dVar2 = dVar2 - dVar15 * 0.0001 * *pdVar24;
            pdVar11[lVar23 + lVar32 + lVar22 + (lVar38 - iVar3)] = dVar2;
            pdVar24 = pdVar24 + lVar39;
          }
          lVar38 = lVar38 + 1;
          pdVar34 = pdVar34 + 1;
          pdVar37 = pdVar37 + 1;
        } while (iVar8 + 1 != (int)lVar38);
      }
      local_3b0 = local_3b0 + lVar29;
      local_3b8 = local_3b8 + lVar33;
    }
  }
  return;
}

Assistant:

void pelelm_dcma (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                              const FArrayBox& datfab, const Geometry& /*geomdata*/,
                              Real /*time*/, const int* /*bcrec*/, int /*level*/)

{   
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(Box(datfab.box()).enclosedCells().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= 2*NUM_SPECIES+2);
    AMREX_ASSERT(ncomp == 4);
    auto const density   = datfab.array(0);
    auto const rhoY      = datfab.array(1);
    auto const Temp      = derfab.array(NUM_SPECIES+1);
    auto const rhoY_dot  = derfab.array(NUM_SPECIES+2);
    auto       mixt_frac = derfab.array(dcomp);
    auto       hr        = derfab.array(dcomp+1);

#ifdef C12H25O2_ID
    auto       Y1        = derfab.array(dcomp+2);
    auto       Y2        = derfab.array(dcomp+3);
    int        OH        = OH_ID;
    int        RO2       = C12H25O2_ID;
#else
    amrex::Abort("C12H25O2 is not present in your chemistry: do not use dcma.");
#endif

    // TODO probably better way to do this ?
    amrex::Real Zox_lcl   = PeleLM::Zox;
    amrex::Real Zfu_lcl   = PeleLM::Zfu;
    amrex::Real denom_inv = 1.0 / (Zfu_lcl - Zox_lcl);
    amrex::GpuArray<amrex::Real,NUM_SPECIES> fact_lcl;
    for (int n=0; n<NUM_SPECIES; ++n) {
        fact_lcl[n] = PeleLM::spec_Bilger_fact[n];
    }

    amrex::ParallelFor(bx, 
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {   
        // Z
        calcMixtFrac(i,j,k,
                     Zox_lcl, denom_inv, fact_lcl.data(),
                     density, rhoY, mixt_frac);
        auto eos = pele::physics::PhysicsType::eos();
        // HR
        amrex::Real hi_spec[NUM_SPECIES] = {0.0};
        eos.T2Hi(Temp(i,j,k),hi_spec);
        hr(i,j,k) = 0.0;
        for (int n = 0; n < NUM_SPECIES; n++) {
            hi_spec[n] *= 0.0001;   // erg/g -> J/kg
            hr(i,j,k) -= rhoY_dot(i,j,k,n)*hi_spec[n];
        }

        // Y
#ifdef C12H25O2_ID
        amrex::Real rho_inv = 1.0 / density(i,j,k);
        Y1(i,j,k) = rhoY(i,j,k,OH)  * rho_inv; 
        Y2(i,j,k) = rhoY(i,j,k,RO2) * rho_inv; 
#endif
    });
}